

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *copy)

{
  long lVar1;
  long lVar2;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    if (0 < copy->fNElements) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        std::__cxx11::string::_M_assign((string *)((long)&(this->fStore->_M_dataplus)._M_p + lVar2))
        ;
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x20;
      } while (lVar1 < copy->fNElements);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}